

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O1

void __thiscall irr::scene::CMeshSceneNode::OnRegisterSceneNode(CMeshSceneNode *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  undefined8 *puVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  
  if ((this->field_0xdc == '\x01') && (this->Mesh != (IMesh *)0x0)) {
    plVar4 = (long *)(**(code **)(**(long **)&this->field_0xc8 + 0x10))();
    this->PassCount = 0;
    if (this->ReadOnlyMaterials == true) {
      uVar2 = (**this->Mesh->_vptr_IMesh)();
    }
    else {
      uVar2 = (int)((ulong)((long)(this->Materials).m_data.
                                  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->Materials).m_data.
                                 super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x1642c859;
    }
    if (uVar2 == 0) {
      bVar11 = true;
      bVar12 = true;
    }
    else {
      lVar7 = 0;
      uVar6 = 0;
      iVar8 = 0;
      iVar10 = 0;
      do {
        if (this->ReadOnlyMaterials == true) {
          iVar3 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,uVar6);
          lVar5 = (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar3))
                            ((undefined8 *)CONCAT44(extraout_var,iVar3));
        }
        else {
          lVar5 = (long)&((this->Materials).m_data.
                          super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>
                          ._M_impl.super__Vector_impl_data._M_start)->TextureLayers[0].Texture +
                  lVar7;
        }
        bVar1 = (**(code **)(*plVar4 + 0x338))(plVar4,lVar5);
        iVar10 = iVar10 + ((byte)~bVar1 & 1);
        iVar8 = iVar8 + (bVar1 & 1);
        if (iVar8 != 0 && iVar10 != 0) {
          bVar11 = false;
          bVar12 = false;
          goto LAB_001ac0c0;
        }
        uVar6 = (ulong)((int)uVar6 + 1);
        lVar7 = lVar7 + 0xb8;
      } while ((ulong)uVar2 * 0xb8 != lVar7);
      bVar11 = iVar10 == 0;
      bVar12 = iVar8 == 0;
    }
LAB_001ac0c0:
    if (!bVar11) {
      (**(code **)(**(long **)&this->field_0xc8 + 0x80))(*(long **)&this->field_0xc8,this,8);
    }
    if (!bVar12) {
      (**(code **)(**(long **)&this->field_0xc8 + 0x80))(*(long **)&this->field_0xc8,this,0x10);
    }
    if (this->field_0xdc == '\x01') {
      for (puVar9 = *(undefined8 **)&this->field_0x98; puVar9 != (undefined8 *)&this->field_0x98;
          puVar9 = (undefined8 *)*puVar9) {
        (**(code **)(*(long *)puVar9[2] + 0x10))();
      }
    }
  }
  return;
}

Assistant:

void CMeshSceneNode::OnRegisterSceneNode()
{
	if (IsVisible && Mesh) {
		// because this node supports rendering of mixed mode meshes consisting of
		// transparent and solid material at the same time, we need to go through all
		// materials, check of what type they are and register this node for the right
		// render pass according to that.

		video::IVideoDriver *driver = SceneManager->getVideoDriver();

		PassCount = 0;
		int transparentCount = 0;
		int solidCount = 0;

		// count transparent and solid materials in this scene node
		const u32 numMaterials = ReadOnlyMaterials ? Mesh->getMeshBufferCount() : Materials.size();
		for (u32 i = 0; i < numMaterials; ++i) {
			const video::SMaterial &material = ReadOnlyMaterials ? Mesh->getMeshBuffer(i)->getMaterial() : Materials[i];

			if (driver->needsTransparentRenderPass(material))
				++transparentCount;
			else
				++solidCount;

			if (solidCount && transparentCount)
				break;
		}

		// register according to material types counted

		if (solidCount)
			SceneManager->registerNodeForRendering(this, scene::ESNRP_SOLID);

		if (transparentCount)
			SceneManager->registerNodeForRendering(this, scene::ESNRP_TRANSPARENT);

		ISceneNode::OnRegisterSceneNode();
	}
}